

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_vector.h
# Opt level: O2

bool __thiscall wasm::SortedVector::erase(SortedVector *this,Index x)

{
  bool bVar1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __dest;
  size_t __n;
  uint *puVar2;
  Index x_local;
  
  __dest = std::
           __lower_bound<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int,__gnu_cxx::__ops::_Iter_less_val>
                     ((this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((__dest._M_current == puVar2) || (*__dest._M_current != x)) {
    bVar1 = false;
  }
  else {
    __n = (long)puVar2 - (long)(__dest._M_current + 1);
    if (__n != 0) {
      memmove(__dest._M_current,__dest._M_current + 1,__n);
      puVar2 = (this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>,
               ((long)puVar2 -
                (long)(this->super_vector<unsigned_int,_std::allocator<unsigned_int>_>).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) - 1);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool erase(Index x) {
    auto it = std::lower_bound(begin(), end(), x);
    if (it != end() && *it == x) {
      std::move(it + 1, end(), it);
      resize(size() - 1);
      return true;
    }
    return false;
  }